

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_attr_uint8(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  size_t in_RSI;
  _internal_exr_context *in_RDI;
  exr_result_t rv;
  exr_result_t local_14;
  
  local_14 = save_attr_sz(in_RDI,in_RSI);
  if (local_14 == 0) {
    local_14 = (*in_RDI->do_write)(in_RDI,(void *)(in_RSI + 0x18),1,&in_RDI->output_file_offset);
  }
  return local_14;
}

Assistant:

static exr_result_t
save_attr_uint8 (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;

    rv = save_attr_sz (ctxt, sizeof (uint8_t));
    if (rv == EXR_ERR_SUCCESS)
        rv = ctxt->do_write (
            ctxt, &(a->uc), sizeof (uint8_t), &(ctxt->output_file_offset));
    return rv;
}